

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

wchar_t ui_entry_search(char *name,wchar_t *ind)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t cmp;
  wchar_t imid;
  wchar_t ihigh;
  wchar_t ilow;
  wchar_t *ind_local;
  char *name_local;
  
  imid = L'\0';
  cmp = n_entry;
  wVar1 = cmp;
  while( true ) {
    cmp = wVar1;
    if (imid == cmp) {
      *ind = imid;
      return L'\0';
    }
    wVar1 = (imid + cmp) / 2;
    iVar2 = strcmp(entries[wVar1]->name,name);
    if (iVar2 == 0) break;
    if (iVar2 < 0) {
      imid = wVar1 + L'\x01';
      wVar1 = cmp;
    }
  }
  *ind = wVar1;
  return L'\x01';
}

Assistant:

static int ui_entry_search(const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = n_entry;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entries[imid]->name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}